

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

bool duckdb::StrpTimeFormat::TryParse(string *format_string,string *text,ParseResult *result)

{
  ulong uVar1;
  bool bVar2;
  InvalidInputException *this;
  uint uVar3;
  pointer pcVar4;
  string error;
  StrpTimeFormat format;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 local_12c;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [120];
  
  StrpTimeFormat((StrpTimeFormat *)local_a8);
  ::std::__cxx11::string::_M_assign((string *)(local_a8 + 8));
  StrTimeFormat::ParseFormatSpecifier(&local_108,format_string,(StrTimeFormat *)local_a8);
  if (local_108._M_string_length == 0) {
    local_128._M_string_length = (size_type)(text->_M_dataplus)._M_p;
    uVar1 = text->_M_string_length;
    uVar3 = (uint)uVar1;
    if (uVar3 < 0xd) {
      local_12c = 0;
      uStack_134 = 0;
      uStack_130 = 0;
      if (uVar3 == 0) {
        local_128._M_string_length = 0;
      }
      else {
        switchD_015de399::default
                  (&uStack_134,(void *)local_128._M_string_length,(ulong)(uVar3 & 0xf));
        local_128._M_string_length = CONCAT44(local_12c,uStack_130);
      }
    }
    else {
      uStack_134 = *(undefined4 *)local_128._M_string_length;
    }
    local_128._M_dataplus._M_p = (pointer)CONCAT44(uStack_134,uVar3);
    pcVar4 = (pointer)local_128._M_string_length;
    if (uVar3 < 0xd) {
      pcVar4 = (char *)((long)&local_128._M_dataplus._M_p + 4);
    }
    bVar2 = Parse((StrpTimeFormat *)local_a8,pcVar4,uVar1 & 0xffffffff,result,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_a8);
    return bVar2;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"Failed to parse format specifier %s: %s","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar4 = (format_string->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar4,pcVar4 + format_string->_M_string_length);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_108._M_dataplus._M_p,
             local_108._M_dataplus._M_p + local_108._M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_128,&local_c8,&local_e8);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool StrpTimeFormat::TryParse(const string &format_string, const string &text, ParseResult &result) {
	StrpTimeFormat format;
	format.format_specifier = format_string;
	string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
	if (!error.empty()) {
		throw InvalidInputException("Failed to parse format specifier %s: %s", format_string, error);
	}
	return format.Parse(text, result);
}